

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O3

void get_mac(byte *buffer,int nbits,byte *out)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  
  if (nbits >> 3 < 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)(uint)(nbits >> 3);
    uVar2 = 0;
    do {
      out[uVar2] = buffer[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  if ((nbits & 7U) != 0) {
    bVar3 = buffer[uVar1];
    if ((nbits & 7U) != 1) {
      bVar3 = '\0';
    }
    out[uVar1] = bVar3;
  }
  return;
}

Assistant:

void get_mac(byte * buffer, int nbits, byte * out)
{
    int nbytes = nbits >> 3;
    int rembits = nbits & 7;
    int mask = rembits ? ((1 < rembits) - 1) : 0;
    int i;
    for (i = 0; i < nbytes; i++)
        out[i] = buffer[i];
    if (rembits)
        out[i] = buffer[i] & mask;
}